

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_protocol.h
# Opt level: O0

string * cppcms::http::protocol::unquote<char_const*>(char **begin,char *end)

{
  char cVar1;
  char *pcVar2;
  char *in_RDX;
  undefined8 *in_RSI;
  string *in_RDI;
  char c;
  char *p;
  string *result;
  char *local_20;
  
  pcVar2 = (char *)*in_RSI;
  std::__cxx11::string::string((string *)in_RDI);
  if ((pcVar2 < in_RDX) && (*pcVar2 == '\"')) {
    std::__cxx11::string::reserve((ulong)in_RDI);
    local_20 = pcVar2 + 1;
    while (local_20 < in_RDX) {
      pcVar2 = local_20 + 1;
      cVar1 = *local_20;
      if (cVar1 == '\"') {
        *in_RSI = pcVar2;
        return in_RDI;
      }
      if ((cVar1 == '\\') && (pcVar2 < in_RDX)) {
        std::__cxx11::string::operator+=((string *)in_RDI,*pcVar2);
        local_20 = local_20 + 2;
      }
      else {
        std::__cxx11::string::operator+=((string *)in_RDI,cVar1);
        local_20 = pcVar2;
      }
    }
    std::__cxx11::string::clear();
  }
  return in_RDI;
}

Assistant:

std::string unquote(It &begin,It end)
	{
		It p=begin;
		std::string result;
		if(p>=end || *p!='\"')
			return result;
		result.reserve(end-p);
		p++;
		while(p < end) {
			char c=*p++;
			if(c=='\"') {
				begin=p;
				return result;
			}
			else if(c=='\\' && p<end)
				result+= *p++;
			else
				result+=c;
		}
		result.clear();
		return result;
	}